

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_parser_parseBlockExpression(sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  size_t startIndex;
  bool bVar1;
  int iVar2;
  int iVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sourcePosition_00;
  sysbvm_tuple_t flags_00;
  sysbvm_tuple_t arguments;
  bool bVar5;
  sysbvm_tuple_t flags;
  sysbvm_tuple_t sourcePosition;
  size_t endPosition;
  sysbvm_tuple_t sequenceNode;
  _Bool isLambda;
  sysbvm_tuple_t argument;
  _Bool hasBlockBar;
  _Bool hasResultType;
  _Bool hasEllipsis;
  sysbvm_tuple_t sStack_38;
  _Bool hasArguments;
  sysbvm_tuple_t resultTypeExpression;
  sysbvm_tuple_t argumentList;
  size_t startPosition;
  sysbvm_parser_state_t *state_local;
  sysbvm_context_t *context_local;
  
  iVar2 = sysbvm_parser_lookKindAt(state,0);
  if (iVar2 != 0xd) {
    sVar4 = sysbvm_parser_makeSourcePositionForParserState(context,state);
    sVar4 = sysbvm_astErrorNode_createWithCString(context,sVar4,"Expected a left curly bracket.");
    return sVar4;
  }
  startIndex = state->tokenPosition;
  state->tokenPosition = state->tokenPosition + 1;
  resultTypeExpression = 0;
  sStack_38 = 0;
  bVar5 = false;
  bVar1 = false;
  while (iVar2 = sysbvm_parser_lookKindAt(state,0), iVar2 == 0x12) {
    sVar4 = sysbvm_parser_parseBlockArgument(context,state);
    if (!bVar5) {
      resultTypeExpression = sysbvm_orderedCollection_create(context);
      bVar5 = true;
    }
    sysbvm_orderedCollection_add(context,resultTypeExpression,sVar4);
  }
  if ((bVar5) && (iVar2 = sysbvm_parser_lookKindAt(state,0), iVar2 == 0x19)) {
    bVar1 = true;
    state->tokenPosition = state->tokenPosition + 1;
  }
  iVar2 = sysbvm_parser_lookKindAt(state,0);
  if (iVar2 == 0x13) {
    state->tokenPosition = state->tokenPosition + 1;
    sStack_38 = sysbvm_parser_parseUnaryExpression(context,state);
  }
  iVar3 = sysbvm_parser_lookKindAt(state,0);
  bVar5 = iVar3 == 0x14;
  if (bVar5) {
    state->tokenPosition = state->tokenPosition + 1;
  }
  else if (iVar2 != 0x13) goto LAB_0014d1eb;
  if (!bVar5) {
    sVar4 = sysbvm_parser_makeSourcePositionForParserState(context,state);
    sVar4 = sysbvm_astErrorNode_createWithCString(context,sVar4,"Expected a lambda block back.");
    return sVar4;
  }
LAB_0014d1eb:
  sVar4 = sysbvm_parser_parseSequenceUntil(context,state,SYSBVM_TOKEN_KIND_RCBRACKET);
  iVar2 = sysbvm_parser_lookKindAt(state,0);
  if (iVar2 == 0xe) {
    state->tokenPosition = state->tokenPosition + 1;
    sourcePosition_00 =
         sysbvm_parser_makeSourcePositionForTokenRange
                   (context,state->sourceCode,state->tokenSequence,startIndex,state->tokenPosition);
    if (bVar5) {
      if (resultTypeExpression == 0) {
        resultTypeExpression = sysbvm_orderedCollection_create(context);
      }
      iVar2 = 0;
      if (bVar1) {
        iVar2 = 2;
      }
      flags_00 = sysbvm_tuple_bitflags_encode((long)iVar2);
      arguments = sysbvm_orderedCollection_asArray(context,resultTypeExpression);
      context_local =
           (sysbvm_context_t *)
           sysbvm_astLambdaNode_create(context,sourcePosition_00,flags_00,arguments,sStack_38,sVar4)
      ;
    }
    else {
      context_local =
           (sysbvm_context_t *)sysbvm_astLexicalBlockNode_create(context,sourcePosition_00,sVar4);
    }
  }
  else {
    sVar4 = sysbvm_parser_makeSourcePositionForParserState(context,state);
    context_local =
         (sysbvm_context_t *)
         sysbvm_astErrorNode_createWithCString(context,sVar4,"Expected a right curly bracket.");
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parseBlockExpression(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
   if(sysbvm_parser_lookKindAt(state, 0) != SYSBVM_TOKEN_KIND_LCBRACKET)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a left curly bracket.");

    size_t startPosition = state->tokenPosition;
    ++state->tokenPosition;

    sysbvm_tuple_t argumentList = SYSBVM_NULL_TUPLE;
    sysbvm_tuple_t resultTypeExpression = SYSBVM_NULL_TUPLE;
    bool hasArguments = false;
    bool hasEllipsis = false;
    bool hasResultType = false;
    bool hasBlockBar = false;
    while(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_COLON)
    {
        sysbvm_tuple_t argument = sysbvm_parser_parseBlockArgument(context, state);

        if(!hasArguments)
        {
            argumentList = sysbvm_orderedCollection_create(context);
            hasArguments = true;
        }

        sysbvm_orderedCollection_add(context, argumentList, argument);
    }

    if(hasArguments && sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_ELLIPSIS)
    {
        hasEllipsis = true;
        ++state->tokenPosition;
    }

    if(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_COLON_COLON)
    {
        ++state->tokenPosition;
        hasResultType = true;
        resultTypeExpression = sysbvm_parser_parseUnaryExpression(context, state);
    }

    if(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_BAR)
    {
        hasBlockBar = true;
        ++state->tokenPosition;
    }

    if((hasBlockBar || hasResultType) && !hasBlockBar)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a lambda block back.");

    bool isLambda = hasBlockBar;

    sysbvm_tuple_t sequenceNode = sysbvm_parser_parseSequenceUntil(context, state, SYSBVM_TOKEN_KIND_RCBRACKET);

    if(sysbvm_parser_lookKindAt(state, 0) != SYSBVM_TOKEN_KIND_RCBRACKET)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a right curly bracket.");

    ++state->tokenPosition;
    size_t endPosition = state->tokenPosition;
    sysbvm_tuple_t sourcePosition = sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, endPosition);

    if(isLambda)
    {
        if(!argumentList)
            argumentList = sysbvm_orderedCollection_create(context);

        sysbvm_tuple_t flags = sysbvm_tuple_bitflags_encode(hasEllipsis ? SYSBVM_FUNCTION_FLAGS_VARIADIC : SYSBVM_FUNCTION_FLAGS_NONE);
        return sysbvm_astLambdaNode_create(context, sourcePosition, flags,
            sysbvm_orderedCollection_asArray(context, argumentList),
            resultTypeExpression, sequenceNode);
    }
    else
    {
        return sysbvm_astLexicalBlockNode_create(context, sourcePosition, sequenceNode);
    }
}